

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-remove-annotations.cc
# Opt level: O2

int realmain(int argc,char **argv)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined8 *puVar3;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  allocator<char> local_81;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf_sp;
  QPDFJob j;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  tuple<QPDF_*,_std::default_delete<QPDF>_> local_68;
  QPDFObjectHandle page;
  string local_50 [32];
  
  whoami = (char *)QUtil::getWhoami(*argv);
  QUtil::setLineBuf(_stdout);
  QPDFJob::QPDFJob(&j);
  QPDFJob::initializeFromArgv((char **)&j,(char *)argv);
  QPDFJob::createQPDF();
  local_68.super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
  super__Head_base<0UL,_QPDF_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>)
       (_Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>)
       qpdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
       super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
  puVar3 = (undefined8 *)QPDF::getAllPages();
  p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
  for (p_Var4 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)*puVar3; p_Var4 != p_Var1;
      p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,p_Var4);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/Annots",&local_81);
    QPDFObjectHandle::removeKey((string *)&page);
    std::__cxx11::string::~string(local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  QPDFJob::writeQPDF((QPDF *)&j);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&qpdf_sp);
  iVar2 = QPDFJob::getExitCode();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  return iVar2;
}

Assistant:

int
realmain(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);
    QUtil::setLineBuf(stdout);

    QPDFJob j;
    try {
        // See "HOW TO ADD A COMMAND-LINE ARGUMENT" in README-maintainer.
        j.initializeFromArgv(argv);
        auto qpdf_sp = j.createQPDF();
        auto& pdf = *qpdf_sp;
        for (auto page: pdf.getAllPages()) {
            page.removeKey("/Annots");
        }
        j.writeQPDF(pdf);
    } catch (QPDFUsage& e) {
        usageExit(e.what());
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << '\n';
        return QPDFJob::EXIT_ERROR;
    }
    return j.getExitCode();
}